

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall FIX::double_conversion::Bignum::Align(Bignum *this,Bignum *other)

{
  Vector<unsigned_int> *this_00;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint *puVar5;
  int iVar6;
  int iVar7;
  
  iVar4 = this->exponent_;
  uVar2 = other->exponent_;
  iVar7 = iVar4 - uVar2;
  if (iVar7 != 0 && (int)uVar2 <= iVar4) {
    if (0x80 < this->used_digits_ + iVar7) {
      abort();
    }
    this_00 = &this->bigits_;
    iVar6 = this->used_digits_;
    while (0 < iVar6) {
      puVar5 = Vector<unsigned_int>::operator[](this_00,iVar6 + -1);
      uVar3 = *puVar5;
      puVar5 = Vector<unsigned_int>::operator[](this_00,iVar6 + ~uVar2 + iVar4);
      *puVar5 = uVar3;
      iVar6 = iVar6 + -1;
    }
    iVar4 = 0;
    iVar6 = 0;
    if (0 < iVar7) {
      iVar4 = iVar7;
      iVar6 = 0;
    }
    for (; iVar4 != iVar6; iVar6 = iVar6 + 1) {
      puVar5 = Vector<unsigned_int>::operator[](this_00,iVar6);
      *puVar5 = 0;
    }
    iVar4 = this->exponent_ - iVar7;
    piVar1 = &this->used_digits_;
    *piVar1 = *piVar1 + iVar7;
    this->exponent_ = iVar4;
    if (*piVar1 < 0) {
      __assert_fail("used_digits_ >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                    ,0x2cc,"void FIX::double_conversion::Bignum::Align(const Bignum &)");
    }
    if (iVar4 < 0) {
      __assert_fail("exponent_ >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                    ,0x2cd,"void FIX::double_conversion::Bignum::Align(const Bignum &)");
    }
  }
  return;
}

Assistant:

void Bignum::Align(const Bignum& other) {
  if (exponent_ > other.exponent_) {
    // If "X" represents a "hidden" digit (by the exponent) then we are in the
    // following case (a == this, b == other):
    // a:  aaaaaaXXXX   or a:   aaaaaXXX
    // b:     bbbbbbX      b: bbbbbbbbXX
    // We replace some of the hidden digits (X) of a with 0 digits.
    // a:  aaaaaa000X   or a:   aaaaa0XX
    int zero_digits = exponent_ - other.exponent_;
    EnsureCapacity(used_digits_ + zero_digits);
    for (int i = used_digits_ - 1; i >= 0; --i) {
      bigits_[i + zero_digits] = bigits_[i];
    }
    for (int i = 0; i < zero_digits; ++i) {
      bigits_[i] = 0;
    }
    used_digits_ += zero_digits;
    exponent_ -= zero_digits;
    ASSERT(used_digits_ >= 0);
    ASSERT(exponent_ >= 0);
  }
}